

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_0::ProgramUniformCase::test(ProgramUniformCase *this)

{
  CallLogWrapper *pCVar1;
  TestLog *log;
  char *__s;
  char *__rhs;
  bool bVar2;
  GLuint GVar3;
  GLuint shader;
  GLuint program;
  ostream *poVar4;
  long lVar5;
  allocator<char> local_25a;
  allocator<char> local_259;
  ApiCase *local_258;
  CallLogWrapper *local_250;
  GLuint local_244;
  long local_240;
  GLuint local_234;
  char *fragmentSourceCStr;
  string fragmentSource;
  GLint size;
  GLenum type;
  ScopedLogSection local_1b0;
  ostringstream frag;
  
  pCVar1 = &(this->super_ApiCase).super_CallLogWrapper;
  GVar3 = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b31);
  shader = glu::CallLogWrapper::glCreateShader(pCVar1,0x8b30);
  program = glu::CallLogWrapper::glCreateProgram(pCVar1);
  glu::CallLogWrapper::glAttachShader(pCVar1,program,GVar3);
  local_244 = shader;
  glu::CallLogWrapper::glAttachShader(pCVar1,program,shader);
  lVar5 = 0;
  glu::CallLogWrapper::glShaderSource(pCVar1,GVar3,1,&test::vertSource,(GLint *)0x0);
  local_250 = pCVar1;
  local_234 = GVar3;
  glu::CallLogWrapper::glCompileShader(pCVar1,GVar3);
  local_258 = &this->super_ApiCase;
  ApiCase::expectError(&this->super_ApiCase,0);
  while( true ) {
    pCVar1 = local_250;
    if (lVar5 == 0x3f0) break;
    log = local_258->m_log;
    __s = *(char **)((long)&DAT_01e20cd0 + lVar5);
    std::__cxx11::string::string<std::allocator<char>>((string *)&frag,__s,&local_259);
    std::__cxx11::string::string<std::allocator<char>>((string *)&type,"Verify type of ",&local_25a)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type,__s);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fragmentSourceCStr,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&size,
                   " variable");
    __rhs = *(char **)((long)&DAT_01e20cd8 + lVar5);
    local_240 = lVar5;
    std::operator+(&fragmentSource,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &fragmentSourceCStr,__rhs);
    tcu::ScopedLogSection::ScopedLogSection(&local_1b0,log,(string *)&frag,&fragmentSource);
    tcu::ScopedLogSection::~ScopedLogSection(&local_1b0);
    std::__cxx11::string::~string((string *)&fragmentSource);
    std::__cxx11::string::~string((string *)&fragmentSourceCStr);
    std::__cxx11::string::~string((string *)&size);
    std::__cxx11::string::~string((string *)&type);
    std::__cxx11::string::~string((string *)&frag);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
    poVar4 = std::operator<<((ostream *)&frag,*(char **)(&DAT_01e20ce8 + local_240));
    poVar4 = std::operator<<(poVar4,"uniform ");
    poVar4 = std::operator<<(poVar4,*(char **)(&DAT_01e20ce0 + local_240));
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,__s);
    poVar4 = std::operator<<(poVar4," uniformValue");
    poVar4 = std::operator<<(poVar4,__rhs);
    std::operator<<(poVar4,";\n");
    std::operator<<((ostream *)&frag,"void main (void)\n");
    std::operator<<((ostream *)&frag,"{\n");
    poVar4 = std::operator<<((ostream *)&frag,"\tgl_FragColor = vec4(");
    poVar4 = std::operator<<(poVar4,*(char **)(&DAT_01e20cf0 + local_240));
    std::operator<<(poVar4,");\n");
    std::operator<<((ostream *)&frag,"}\n");
    std::__cxx11::stringbuf::str();
    GVar3 = local_244;
    pCVar1 = local_250;
    fragmentSourceCStr =
         (char *)CONCAT17(fragmentSource._M_dataplus._M_p._7_1_,
                          fragmentSource._M_dataplus._M_p._0_7_);
    glu::CallLogWrapper::glShaderSource(local_250,local_244,1,&fragmentSourceCStr,(GLint *)0x0);
    std::__cxx11::string::~string((string *)&fragmentSource);
    glu::CallLogWrapper::glCompileShader(pCVar1,GVar3);
    glu::CallLogWrapper::glLinkProgram(local_250,program);
    bVar2 = verifyProgramParam((((ApiCase *)&local_258->super_TestCase)->super_TestCase).
                               super_TestCase.super_TestNode.m_testCtx,local_250,program,0x8b82,1);
    lVar5 = local_240;
    if (bVar2) {
      fragmentSourceCStr = (char *)((ulong)fragmentSourceCStr & 0xffffffff00000000);
      fragmentSource._M_string_length._0_7_ = 0x6f74206e6574;
      size = 0;
      fragmentSource._M_dataplus._M_p._0_7_ = 0x69727720746f6e;
      fragmentSource._M_dataplus._M_p._7_1_ = 0x74;
      type = 0;
      glu::CallLogWrapper::glGetActiveUniform
                (local_250,program,0,0,(GLsizei *)&fragmentSourceCStr,&size,&type,
                 (GLchar *)&fragmentSource);
      checkIntEquals((((ApiCase *)&local_258->super_TestCase)->super_TestCase).super_TestCase.
                     super_TestNode.m_testCtx,type,*(GLint *)(&DAT_01e20cf8 + lVar5));
      checkIntEquals((((ApiCase *)&local_258->super_TestCase)->super_TestCase).super_TestCase.
                     super_TestNode.m_testCtx,size,*(GLint *)(&DAT_01e20cfc + lVar5));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
    lVar5 = lVar5 + 0x38;
  }
  glu::CallLogWrapper::glDeleteShader(local_250,local_234);
  glu::CallLogWrapper::glDeleteShader(pCVar1,local_244);
  glu::CallLogWrapper::glDeleteProgram(pCVar1,program);
  ApiCase::expectError(local_258,0);
  return;
}

Assistant:

void test (void)
	{
		const struct UniformType
		{
			const char* declaration;
			const char* postDeclaration;
			const char* precision;
			const char* layout;
			const char* getter;
			GLenum		type;
			GLint		size;
			GLint		isRowMajor;
		} uniformTypes[] =
		{
			{ "float",					"",			"highp",	"",				"uniformValue",													GL_FLOAT,							1, GL_FALSE },
			{ "float",					"[2]",		"highp",	"",				"uniformValue[1]",												GL_FLOAT,							2, GL_FALSE },
			{ "vec2",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC2,						1, GL_FALSE },
			{ "vec3",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC3,						1, GL_FALSE },
			{ "vec4",					"",			"highp",	"",				"uniformValue.x",												GL_FLOAT_VEC4,						1, GL_FALSE },
			{ "int",					"",			"highp",	"",				"float(uniformValue)",											GL_INT,								1, GL_FALSE },
			{ "ivec2",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC2,						1, GL_FALSE },
			{ "ivec3",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC3,						1, GL_FALSE },
			{ "ivec4",					"",			"highp",	"",				"float(uniformValue.x)",										GL_INT_VEC4,						1, GL_FALSE },
			{ "bool",					"",			"",			"",				"float(uniformValue)",											GL_BOOL,							1, GL_FALSE },
			{ "bvec2",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC2,						1, GL_FALSE },
			{ "bvec3",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC3,						1, GL_FALSE },
			{ "bvec4",					"",			"",			"",				"float(uniformValue.x)",										GL_BOOL_VEC4,						1, GL_FALSE },
			{ "mat2",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT2,						1, GL_FALSE },
			{ "mat3",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT3,						1, GL_FALSE },
			{ "mat4",					"",			"highp",	"",				"float(uniformValue[0][0])",									GL_FLOAT_MAT4,						1, GL_FALSE },
			{ "sampler2D",				"",			"highp",	"",				"float(texture2D(uniformValue, vec2(0.0, 0.0)).r)",				GL_SAMPLER_2D,						1, GL_FALSE },
			{ "samplerCube",			"",			"highp",	"",				"float(textureCube(uniformValue, vec3(0.0, 0.0, 0.0)).r)",		GL_SAMPLER_CUBE,					1, GL_FALSE },
		};

		static const char* vertSource =
			"void main (void)\n"
			"{\n"
			"	gl_Position = vec4(0.0);\n"
			"}\n\0";

		GLuint shaderVert	= glCreateShader(GL_VERTEX_SHADER);
		GLuint shaderFrag	= glCreateShader(GL_FRAGMENT_SHADER);
		GLuint program		= glCreateProgram();

		glAttachShader(program, shaderVert);
		glAttachShader(program, shaderFrag);

		glShaderSource(shaderVert, 1, &vertSource, DE_NULL);
		glCompileShader(shaderVert);
		expectError(GL_NO_ERROR);

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(uniformTypes); ++ndx)
		{
			tcu::ScopedLogSection(m_log, uniformTypes[ndx].declaration, std::string("Verify type of ") + uniformTypes[ndx].declaration + " variable" + uniformTypes[ndx].postDeclaration );

			// gen fragment shader

			std::ostringstream frag;
			frag << uniformTypes[ndx].layout << "uniform " << uniformTypes[ndx].precision << " " << uniformTypes[ndx].declaration << " uniformValue" << uniformTypes[ndx].postDeclaration << ";\n";
			frag << "void main (void)\n";
			frag << "{\n";
			frag << "	gl_FragColor = vec4(" << uniformTypes[ndx].getter << ");\n";
			frag << "}\n";

			{
				std::string fragmentSource = frag.str();
				const char* fragmentSourceCStr = fragmentSource.c_str();
				glShaderSource(shaderFrag, 1, &fragmentSourceCStr, DE_NULL);
			}

			// compile & link

			glCompileShader(shaderFrag);
			glLinkProgram(program);

			// test
			if (verifyProgramParam(m_testCtx, *this, program, GL_LINK_STATUS, GL_TRUE))
			{
				const GLint index = 0; // first and only active uniform

				char buffer[]	= "not written to"; // not written to
				GLint written	= 0;
				GLint size		= 0;
				GLenum type		= 0;
				glGetActiveUniform(program, index, 0, &written, &size, &type, buffer);

				checkIntEquals(m_testCtx, type, uniformTypes[ndx].type);
				checkIntEquals(m_testCtx, size, uniformTypes[ndx].size);
			}
		}

		glDeleteShader(shaderVert);
		glDeleteShader(shaderFrag);
		glDeleteProgram(program);
		expectError(GL_NO_ERROR);
	}